

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_merge(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pDest;
  int iVar1;
  jx9_value *pValue;
  int local_44;
  int i;
  jx9_value *pArray;
  jx9_hashmap *pSrc;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    pValue = jx9_context_new_array(pCtx);
    if (pValue == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
    }
    else {
      pDest = (jx9_hashmap *)(pValue->x).pOther;
      for (local_44 = 0; local_44 < nArg; local_44 = local_44 + 1) {
        iVar1 = jx9_value_is_json_array(apArg[local_44]);
        if (iVar1 == 0) {
          jx9_array_add_elem(pValue,(jx9_value *)0x0,apArg[local_44]);
        }
        else {
          HashmapMerge((jx9_hashmap *)(apArg[local_44]->x).pOther,pDest);
        }
      }
      jx9_result_value(pCtx,pValue);
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_merge(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap, *pSrc;
	jx9_value *pArray;
	int i;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)pArray->x.pOther;
	/* Start merging */
	for( i = 0 ; i < nArg ; i++ ){
		/* Make sure we are dealing with a valid hashmap */
		if( !jx9_value_is_json_array(apArg[i]) ){
			/* Insert scalar value */
			jx9_array_add_elem(pArray, 0, apArg[i]);
		}else{
			pSrc = (jx9_hashmap *)apArg[i]->x.pOther;
			/* Merge the two hashmaps */
			HashmapMerge(pSrc, pMap);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}